

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exactfloat.cc
# Opt level: O2

ExactFloat operator*(ExactFloat *a,ExactFloat *b)

{
  int iVar1;
  int iVar2;
  BN_CTX *ctx;
  int iVar3;
  ExactFloat *in_RDX;
  BIGNUM *extraout_RDX;
  BIGNUM *extraout_RDX_00;
  int sign;
  ExactFloat EVar5;
  S2LogMessage SStack_38;
  BigNum BVar4;
  
  sign = in_RDX->sign_ * b->sign_;
  iVar2 = b->bn_exp_;
  if (iVar2 < 0x7ffffffd) {
    iVar3 = in_RDX->bn_exp_;
    if (iVar3 < 0x7ffffffd) {
      ExactFloat::ExactFloat(a);
      a->sign_ = sign;
      a->bn_exp_ = in_RDX->bn_exp_ + b->bn_exp_;
      ctx = BN_CTX_new();
      iVar2 = BN_mul((BIGNUM *)(a->bn_).bn_,(BIGNUM *)(b->bn_).bn_,(BIGNUM *)(in_RDX->bn_).bn_,ctx);
      if (iVar2 == 0) {
        S2LogMessage::S2LogMessage
                  (&SStack_38,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/math/exactfloat/exactfloat.cc"
                   ,0x276,kFatal,(ostream *)&std::cerr);
        std::operator<<(SStack_38.stream_,
                        "Check failed: BN_mul(r.bn_.get(), a.bn_.get(), b.bn_.get(), ctx) ");
        goto LAB_0026b7d6;
      }
      BN_CTX_free(ctx);
      ExactFloat::Canonicalize(a);
      BVar4.bn_ = extraout_RDX;
      goto LAB_0026b711;
    }
LAB_0026b6fe:
    b = in_RDX;
    if (iVar3 != 0x7fffffff) {
      iVar1 = iVar3;
      if ((iVar2 == 0x7ffffffe) || (iVar1 = iVar2, iVar3 == 0x7ffffffe)) {
        if (iVar1 == 0x7ffffffd) {
          EVar5 = ExactFloat::NaN();
          BVar4 = EVar5.bn_.bn_;
        }
        else {
          EVar5 = ExactFloat::Infinity(a,sign);
          BVar4 = EVar5.bn_.bn_;
        }
      }
      else {
        if (iVar3 != 0x7ffffffd && iVar2 != 0x7ffffffd) {
          S2LogMessage::S2LogMessage
                    (&SStack_38,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/math/exactfloat/exactfloat.cc"
                     ,0x26f,kFatal,(ostream *)&std::cerr);
          std::operator<<(SStack_38.stream_,"Check failed: a.is_zero() || b.is_zero() ");
LAB_0026b7d6:
          abort();
        }
        EVar5 = ExactFloat::SignedZero(a,sign);
        BVar4 = EVar5.bn_.bn_;
      }
      goto LAB_0026b711;
    }
  }
  else if (iVar2 != 0x7fffffff) {
    iVar3 = in_RDX->bn_exp_;
    goto LAB_0026b6fe;
  }
  ExactFloat::ExactFloat(a,b);
  BVar4.bn_ = extraout_RDX_00;
LAB_0026b711:
  EVar5.bn_.bn_ = BVar4.bn_;
  EVar5._0_8_ = a;
  return EVar5;
}

Assistant:

ExactFloat operator*(const ExactFloat& a, const ExactFloat& b) {
  int result_sign = a.sign_ * b.sign_;
  if (!a.is_normal() || !b.is_normal()) {
    // Handle zero, infinity, and NaN according to IEEE 754-2008.
    if (a.is_nan()) return a;
    if (b.is_nan()) return b;
    if (a.is_inf()) {
      // Infinity times zero yields NaN.
      if (b.is_zero()) return ExactFloat::NaN();
      return ExactFloat::Infinity(result_sign);
    }
    if (b.is_inf()) {
      if (a.is_zero()) return ExactFloat::NaN();
      return ExactFloat::Infinity(result_sign);
    }
    S2_DCHECK(a.is_zero() || b.is_zero());
    return ExactFloat::SignedZero(result_sign);
  }
  ExactFloat r;
  r.sign_ = result_sign;
  r.bn_exp_ = a.bn_exp_ + b.bn_exp_;
  BN_CTX* ctx = BN_CTX_new();
  S2_CHECK(BN_mul(r.bn_.get(), a.bn_.get(), b.bn_.get(), ctx));
  BN_CTX_free(ctx);
  r.Canonicalize();
  return r;
}